

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

void __thiscall imrt::Collimator::printReference(Collimator *this)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  long *plVar3;
  key_type_conflict local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reference list",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_34 = 0;
  if (0 < this->ref_size) {
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pmVar2 = std::
               map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               ::operator[](&this->reference,&local_34);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pmVar2->first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
      pmVar2 = std::
               map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               ::operator[](&this->reference,&local_34);
      plVar3 = (long *)std::ostream::operator<<((ostream *)poVar1,pmVar2->second);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      local_34 = local_34 + 1;
    } while (local_34 < this->ref_size);
  }
  return;
}

Assistant:

void Collimator::printReference () {
    cout << "Reference list" << endl;
    for (int i=0; i < ref_size; i++) {
      cout << i << " " << reference[i].first << "," << reference[i].second << endl;
    }
  }